

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

bool is_safe_spell(CHAR_DATA *ch,CHAR_DATA *victim,bool area)

{
  CHAR_DATA *pCVar1;
  CHAR_DATA *pCVar2;
  bool bVar3;
  CHAR_DATA *bch;
  
  if (victim->in_room == (ROOM_INDEX_DATA *)0x0) {
    return true;
  }
  if (((ch->in_room == (ROOM_INDEX_DATA *)0x0) || (victim == ch && area)) ||
     (bVar3 = is_affected_by(victim,0x1e), bVar3)) {
    return true;
  }
  if (victim == ch) {
    return false;
  }
  if (victim->fighting == ch) {
    return false;
  }
  bVar3 = is_immortal(ch);
  if ((bVar3) && (0x34 < ch->level && !area)) {
    return false;
  }
  bVar3 = is_npc(victim);
  if (((!bVar3) && (victim->pcdata->newbie == true)) && (bVar3 = is_npc(ch), !bVar3)) {
    return true;
  }
  bVar3 = is_npc(ch);
  if (((!bVar3) && (ch->pcdata->newbie == true)) && (bVar3 = is_npc(victim), !bVar3)) {
    return true;
  }
  bVar3 = is_npc(victim);
  if (bVar3) {
    if ((victim->in_room->room_flags[0] & 0x400) != 0) {
      return true;
    }
    if (victim->pIndexData->pShop != (SHOP_DATA *)0x0) {
      return true;
    }
    if ((victim->act[0] & 0x4000600) != 0) {
      return true;
    }
    bVar3 = is_npc(ch);
    if (bVar3) {
      if (!area) {
        return false;
      }
      bch = ch->fighting;
      goto LAB_00298bc6;
    }
    if ((victim->act[0] & 0x100) != 0) {
      return true;
    }
    bVar3 = is_affected_by(victim,0x12);
    if (bVar3) {
      if (area) {
        return true;
      }
      if (victim->master != ch) {
        return true;
      }
    }
    bch = victim->fighting;
    pCVar2 = ch;
    pCVar1 = bch;
  }
  else {
    if (((area) && (bVar3 = is_immortal(victim), bVar3)) && (0x34 < victim->level)) {
      return true;
    }
    bVar3 = is_npc(ch);
    if (!bVar3) {
      bVar3 = is_cabal(ch);
      if (!bVar3) {
        return true;
      }
      if ((victim->act[0] & 0x6000000) != 0) {
        return false;
      }
      bVar3 = is_cabal(victim);
      if (!bVar3) {
        return true;
      }
      if ((int)ch->level <= victim->level + 8) {
        return false;
      }
      return true;
    }
    bVar3 = is_affected_by(ch,0x12);
    if (((bVar3) && (ch->master != (CHAR_DATA *)0x0)) && (ch->master->fighting != victim)) {
      return true;
    }
    if ((victim->in_room->room_flags[0] & 0x400) != 0) {
      return true;
    }
    pCVar2 = ch->fighting;
    bch = victim;
    pCVar1 = ch->fighting;
  }
  victim = pCVar2;
  if (pCVar1 == (CHAR_DATA *)0x0) {
    return false;
  }
LAB_00298bc6:
  bVar3 = is_same_group(victim,bch);
  if (bVar3) {
    return false;
  }
  return true;
}

Assistant:

bool is_safe_spell(CHAR_DATA *ch, CHAR_DATA *victim, bool area)
{
	if (victim->in_room == nullptr || ch->in_room == nullptr)
		return true;

	if (victim == ch && area)
		return true;

	if (is_affected_by(victim, AFF_NOSHOW))
		return true;

	if (victim->fighting == ch || victim == ch)
		return false;

	if (is_immortal(ch) && ch->level > LEVEL_IMMORTAL && !area)
		return false;

	if (!is_npc(victim) && victim->pcdata->newbie == true && !is_npc(ch))
		return true;

	if (!is_npc(ch) && ch->pcdata->newbie == true && !is_npc(victim))
		return true;

	/* killing mobiles */
	if (is_npc(victim))
	{
		/* safe room? */
		if (IS_SET(victim->in_room->room_flags, ROOM_SAFE))
			return true;

		if (victim->pIndexData->pShop != nullptr)
			return true;

		/* no killing healers, trainers, etc */
		if (IS_SET(victim->act, ACT_TRAIN) || IS_SET(victim->act, ACT_PRACTICE) || IS_SET(victim->act, ACT_IS_HEALER))
			return true;

		if (!is_npc(ch))
		{
			/* no pets */
			if (IS_SET(victim->act, ACT_PET))
				return true;

			/* no charmed creatures unless owner */
			if (is_affected_by(victim, AFF_CHARM) && (area || ch != victim->master))
				return true;

			/* legal kill? -- cannot hit mob fighting non-group member */
			if (victim->fighting != nullptr && !is_same_group(ch, victim->fighting))
				return true;
		}
		else
		{
			/* area effect spells do not hit other mobs */
			if (area && !is_same_group(victim, ch->fighting))
				return true;
		}
	}
	/* killing players */
	else
	{
		if (area && is_immortal(victim) && victim->level > LEVEL_IMMORTAL)
			return true;

		/* NPC doing the killing */
		if (is_npc(ch))
		{
			/* charmed mobs and pets cannot attack players while owned */
			if (is_affected_by(ch, AFF_CHARM) && ch->master != nullptr && ch->master->fighting != victim)
				return true;

			/* safe room? */
			if (IS_SET(victim->in_room->room_flags, ROOM_SAFE))
				return true;

			/* legal kill? -- mobs only hit players grouped with opponent*/
			if (ch->fighting != nullptr && !is_same_group(ch->fighting, victim))
				return true;
		}

		/* player doing the killing */
		else
		{
			if (!is_cabal(ch))
				return true;

			if (IS_SET(victim->act, PLR_KILLER) || IS_SET(victim->act, PLR_THIEF))
				return false;

			if (!is_cabal(victim))
				return true;

			if (ch->level > victim->level + 8)
				return true;
		}
	}

	return false;
}